

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidBatchnorm(void)

{
  pointer pcVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  Type *pTVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  TypeUnion this;
  Type *this_00;
  LayerUnion this_01;
  WeightParams *pWVar7;
  ostream *poVar8;
  int iVar9;
  int iVar10;
  Result res;
  Model m1;
  undefined1 local_80 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Model local_58;
  
  CoreML::Specification::Model::Model(&local_58);
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar3);
    local_58.description_ = pMVar3;
  }
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_80 + 0x10;
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar4->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  pFVar5 = pTVar4->type_;
  if (pFVar5 == (FeatureType *)0x0) {
    pFVar5 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar5);
    pTVar4->type_ = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] == 5) {
    pAVar6 = (pFVar5->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    pAVar6 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar6);
    (pFVar5->Type_).multiarraytype_ = pAVar6;
  }
  iVar9 = (pAVar6->shape_).current_size_;
  if (iVar9 == (pAVar6->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar6->shape_,iVar9 + 1);
    iVar9 = (pAVar6->shape_).current_size_;
  }
  (pAVar6->shape_).current_size_ = iVar9 + 1;
  ((pAVar6->shape_).rep_)->elements[iVar9] = 1;
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar3);
    local_58.description_ = pMVar3;
  }
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar4->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  pFVar5 = pTVar4->type_;
  if (pFVar5 == (FeatureType *)0x0) {
    pFVar5 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar5);
    pTVar4->type_ = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    pAVar6 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar6);
    (pFVar5->Type_).multiarraytype_ = pAVar6;
  }
  if (local_58._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_58);
    local_58._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_58.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_58.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  if (this_00->_oneof_case_[0] == 0xa0) {
    this_01 = this_00->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0xa0;
    this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0x48);
    CoreML::Specification::BatchnormLayerParams::BatchnormLayerParams(this_01.batchnorm_);
    (this_00->layer_).batchnorm_ = (BatchnormLayerParams *)this_01;
  }
  (this_01.batchnorm_)->channels_ = 5;
  iVar9 = 5;
  do {
    pWVar7 = (this_01.innerproduct_)->bias_;
    if (pWVar7 == (WeightParams *)0x0) {
      pWVar7 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar7);
      (this_01.innerproduct_)->bias_ = pWVar7;
    }
    iVar10 = (pWVar7->floatvalue_).current_size_;
    if (iVar10 == (pWVar7->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(&pWVar7->floatvalue_,iVar10 + 1);
      iVar10 = (pWVar7->floatvalue_).current_size_;
    }
    (pWVar7->floatvalue_).current_size_ = iVar10 + 1;
    ((pWVar7->floatvalue_).rep_)->elements[iVar10] = 1.0;
    pWVar7 = (WeightParams *)((this_01.activation_)->NonlinearityType_).relu_;
    if (pWVar7 == (WeightParams *)0x0) {
      pWVar7 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar7);
      ((this_01.activation_)->NonlinearityType_).relu_ = (ActivationReLU *)pWVar7;
    }
    iVar10 = (pWVar7->floatvalue_).current_size_;
    if (iVar10 == (pWVar7->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(&pWVar7->floatvalue_,iVar10 + 1);
      iVar10 = (pWVar7->floatvalue_).current_size_;
    }
    (pWVar7->floatvalue_).current_size_ = iVar10 + 1;
    ((pWVar7->floatvalue_).rep_)->elements[iVar10] = 1.0;
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  CoreML::validate<(MLModelType)500>((Result *)local_80,&local_58);
  bVar2 = CoreML::Result::good((Result *)local_80);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xb28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._8_8_ != &local_68) {
    operator_delete((void *)local_80._8_8_,local_68._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_58);
  return (uint)bVar2;
}

Assistant:

int testInvalidBatchnorm() {

    Specification::Model m1;

    int num_inputs = 5;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *batchnormLayer = nn->add_layers();
    batchnormLayer->add_input("input");
    batchnormLayer->add_output("probs");
    auto *params = batchnormLayer->mutable_batchnorm();
    params->set_channels(num_inputs);

    for (int i = 0; i < num_inputs; i++) {
        params->mutable_beta()->add_floatvalue(1.0);
        params->mutable_gamma()->add_floatvalue(1.0);
    }
    // Invalid because the mean and variance should be provided

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}